

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_accumulate(secp256k1_sha256 *acc,secp256k1_scalar *x,secp256k1_scratch *scratch)

{
  int iVar1;
  uchar zerobyte [1];
  size_t size;
  uchar bytes [65];
  secp256k1_ge r;
  secp256k1_gej infj;
  secp256k1_gej gj;
  secp256k1_gej rj6;
  secp256k1_gej rj5;
  secp256k1_gej rj4;
  secp256k1_gej rj3;
  secp256k1_gej rj2;
  secp256k1_gej rj1;
  secp256k1_scalar *in_stack_00000780;
  secp256k1_ge *in_stack_00000788;
  secp256k1_gej *in_stack_00000790;
  secp256k1_ge *in_stack_fffffffffffffb28;
  size_t *size_00;
  secp256k1_gej *in_stack_fffffffffffffb30;
  secp256k1_ge *in_stack_fffffffffffffb38;
  secp256k1_sha256 *hash;
  secp256k1_gej *in_stack_fffffffffffffb78;
  secp256k1_ge *in_stack_fffffffffffffb80;
  secp256k1_ge *in_stack_fffffffffffffba8;
  secp256k1_gej *in_stack_fffffffffffffbb0;
  void *in_stack_fffffffffffffc10;
  secp256k1_ecmult_multi_callback *in_stack_fffffffffffffc18;
  secp256k1_scalar *in_stack_fffffffffffffc20;
  secp256k1_gej *in_stack_fffffffffffffc28;
  secp256k1_scratch *in_stack_fffffffffffffc30;
  secp256k1_callback *in_stack_fffffffffffffc38;
  size_t in_stack_fffffffffffffc50;
  secp256k1_scalar *in_stack_fffffffffffffc60;
  secp256k1_gej *in_stack_fffffffffffffc68;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffffc70;
  
  hash = (secp256k1_sha256 *)0x41;
  secp256k1_gej_set_ge(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  secp256k1_gej_set_infinity((secp256k1_gej *)0x1398c9);
  secp256k1_ecmult_gen
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  secp256k1_ecmult((secp256k1_gej *)rj3.y.n[1],(secp256k1_gej *)rj3.y.n[0],
                   (secp256k1_scalar *)rj3.x.n[4],(secp256k1_scalar *)rj3.x.n[3]);
  secp256k1_ecmult((secp256k1_gej *)rj3.y.n[1],(secp256k1_gej *)rj3.y.n[0],
                   (secp256k1_scalar *)rj3.x.n[4],(secp256k1_scalar *)rj3.x.n[3]);
  iVar1 = secp256k1_ecmult_multi_var
                    (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                     in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                     in_stack_fffffffffffffc50);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1521,
            "test condition failed: secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj4, x, NULL, NULL, 0)"
           );
    abort();
  }
  size_00 = (size_t *)0x1;
  iVar1 = secp256k1_ecmult_multi_var
                    (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                     in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                     in_stack_fffffffffffffc50);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1522,
            "test condition failed: secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj5, &secp256k1_scalar_zero, test_ecmult_accumulate_cb, (void*)x, 1)"
           );
    abort();
  }
  secp256k1_ecmult_const(in_stack_00000790,in_stack_00000788,in_stack_00000780);
  secp256k1_ge_set_gej_var(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1525,"test condition failed: secp256k1_gej_eq_ge_var(&rj2, &r)");
    abort();
  }
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1526,"test condition failed: secp256k1_gej_eq_ge_var(&rj3, &r)");
    abort();
  }
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1527,"test condition failed: secp256k1_gej_eq_ge_var(&rj4, &r)");
    abort();
  }
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1528,"test condition failed: secp256k1_gej_eq_ge_var(&rj5, &r)");
    abort();
  }
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1529,"test condition failed: secp256k1_gej_eq_ge_var(&rj6, &r)");
    abort();
  }
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x139c44);
  if (iVar1 == 0) {
    secp256k1_eckey_pubkey_serialize
              (in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30,size_00,0);
    if (hash != (secp256k1_sha256 *)0x41) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1531,"test condition failed: size == 65");
      abort();
    }
    secp256k1_sha256_write
              ((secp256k1_sha256 *)0x41,(uchar *)in_stack_fffffffffffffb38,
               (size_t)in_stack_fffffffffffffb30);
  }
  else {
    memset(&stack0xfffffffffffffb3f,0,1);
    secp256k1_sha256_write
              (hash,(uchar *)in_stack_fffffffffffffb38,(size_t)in_stack_fffffffffffffb30);
  }
  return;
}

Assistant:

static void test_ecmult_accumulate(secp256k1_sha256* acc, const secp256k1_scalar* x, secp256k1_scratch* scratch) {
    /* Compute x*G in 6 different ways, serialize it uncompressed, and feed it into acc. */
    secp256k1_gej rj1, rj2, rj3, rj4, rj5, rj6, gj, infj;
    secp256k1_ge r;
    unsigned char bytes[65];
    size_t size = 65;
    secp256k1_gej_set_ge(&gj, &secp256k1_ge_const_g);
    secp256k1_gej_set_infinity(&infj);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &rj1, x);
    secp256k1_ecmult(&rj2, &gj, x, &secp256k1_scalar_zero);
    secp256k1_ecmult(&rj3, &infj, &secp256k1_scalar_zero, x);
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj4, x, NULL, NULL, 0));
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj5, &secp256k1_scalar_zero, test_ecmult_accumulate_cb, (void*)x, 1));
    secp256k1_ecmult_const(&rj6, &secp256k1_ge_const_g, x);
    secp256k1_ge_set_gej_var(&r, &rj1);
    CHECK(secp256k1_gej_eq_ge_var(&rj2, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj3, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj4, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj5, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj6, &r));
    if (secp256k1_ge_is_infinity(&r)) {
        /* Store infinity as 0x00 */
        const unsigned char zerobyte[1] = {0};
        secp256k1_sha256_write(acc, zerobyte, 1);
    } else {
        /* Store other points using their uncompressed serialization. */
        secp256k1_eckey_pubkey_serialize(&r, bytes, &size, 0);
        CHECK(size == 65);
        secp256k1_sha256_write(acc, bytes, size);
    }
}